

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O2

Utest * __thiscall
TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_TestShell::createTest
          (TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/CppUTest_Tests/namers/CppUTestNamerTests.cpp"
                                  ,0x39);
  TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test::
  TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test
            ((TEST_NamerTestGroup_ItCanGiveYouTheTestDirectory_Test *)this_00);
  return this_00;
}

Assistant:

TEST(NamerTestGroup, ItCanGiveYouTheTestDirectory)
{
    // This should work with CaseSensitive::Yes.
    // However, it would fail when run in Visual Studio 2017 as lower-case source-file names are returned.
    // We've fixed this for filenames, but not directory names, so this test ignores case.
    // See https://stackoverflow.com/questions/49068785/how-to-find-the-filename-from-a-c11-stat-objects-file-serial-number-on-window
    auto suppress_subdirectory = Approvals::useApprovalsSubdirectory("");
    ApprovalTestNamer namer;
    auto sep = SystemUtils::getDirectorySeparator();
    checkEndsWithIgnoringCase(namer.getDirectory(),
                              sep + "CppUTest_Tests" + sep + "namers" + sep);
}